

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O3

int libtorrent::unchoke_sort
              (vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
               *peers,int max_upload_rate,time_duration unchoke_interval,session_settings *sett)

{
  mutex *pmVar1;
  _Tuple_impl<0UL,_std::_Placeholder<1>,_std::_Placeholder<2>,_int> _Var2;
  peer_connection *ppVar3;
  long lVar4;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *pvVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var9;
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *__range2;
  uint uVar10;
  int iVar11;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  __nth;
  peer_connection **pppVar12;
  __normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
  _Var13;
  unique_lock<std::mutex> l;
  undefined1 local_68 [16];
  vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_> *local_58;
  mutex *local_50;
  rep local_48;
  _Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
  local_40;
  
  pmVar1 = &sett->m_mutex;
  local_68._8_4_ = local_68._8_4_ & 0xffffff00;
  local_68._0_8_ = pmVar1;
  local_48 = unchoke_interval.__r;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  iVar6 = (sett->m_store).m_ints._M_elems[0x1f];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  if (iVar6 == 3) {
    _Var13._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var9._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (_Var13._M_current != _Var9._M_current) {
      do {
        ppVar3 = *_Var13._M_current;
        iVar6 = (*(ppVar3->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])(ppVar3);
        if (((char)iVar6 == '\0') &&
           (((ppVar3->super_peer_connection_hot_members).field_0x28 & 0x10) != 0)) {
          if ((ppVar3->field_0x762 & 0x40) == 0) {
            peer_connection::decrease_est_reciprocation_rate(ppVar3);
          }
          else {
            peer_connection::increase_est_reciprocation_rate(ppVar3);
          }
        }
        _Var13._M_current = _Var13._M_current + 1;
      } while (_Var13._M_current != _Var9._M_current);
      _Var13._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var9._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (_Var13._M_current != _Var9._M_current) {
      uVar7 = (long)_Var9._M_current - (long)_Var13._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_68._0_8_ = anon_unknown_10::bittyrant_unchoke_compare;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var13,_Var9,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
                  *)local_68);
      local_40._M_comp._M_f = anon_unknown_10::bittyrant_unchoke_compare;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var13,_Var9,&local_40);
      _Var13._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var9._M_current =
           (peers->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    iVar6 = 0;
    while( true ) {
      if (_Var13._M_current == _Var9._M_current) {
        return iVar6;
      }
      ppVar3 = *_Var13._M_current;
      if (max_upload_rate < ppVar3->m_est_reciprocation_rate) break;
      iVar6 = iVar6 + 1;
      _Var13._M_current = _Var13._M_current + 1;
      max_upload_rate = max_upload_rate - ppVar3->m_est_reciprocation_rate;
    }
    return iVar6;
  }
  local_68[8] = false;
  local_68._0_8_ = pmVar1;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  uVar8 = (sett->m_store).m_ints._M_elems[0x53];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = false;
  local_68._0_8_ = pmVar1;
  local_50 = pmVar1;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = 1;
  iVar6 = (sett->m_store).m_ints._M_elems[0x1f];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  pmVar1 = local_50;
  _Var13._M_current =
       (peers->
       super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_58 = peers;
  if (iVar6 == 2) {
    _Var9._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    if (_Var9._M_current == _Var13._M_current) {
      uVar10 = 1;
      _Var13._M_current = _Var9._M_current;
    }
    else {
      uVar7 = (long)_Var13._M_current - (long)_Var9._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_68._0_8_ = anon_unknown_10::upload_rate_compare;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var9,_Var13,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
                  *)local_68);
      pvVar5 = local_58;
      local_40._M_comp._M_f = anon_unknown_10::upload_rate_compare;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
                (_Var9,_Var13,&local_40);
      _Var9._M_current =
           (pvVar5->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var13._M_current =
           (pvVar5->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (_Var9._M_current == _Var13._M_current) {
        uVar10 = 1;
      }
      else {
        iVar11 = 0;
        iVar6 = 0;
        pppVar12 = _Var9._M_current;
        do {
          iVar11 = iVar11 + 0x400;
          if ((int)(((((*pppVar12)->m_statistics).m_stat[0].m_total_counter -
                     (*pppVar12)->m_uploaded_at_last_round) * 1000) / (local_48 / 1000000)) < iVar11
             ) break;
          iVar6 = iVar6 + 1;
          pppVar12 = pppVar12 + 1;
        } while (pppVar12 != _Var13._M_current);
        uVar10 = iVar6 + 1;
      }
    }
  }
  else {
    uVar10 = 0x7fffffff;
    if (uVar8 < 0x7fffffff) {
      uVar10 = uVar8;
    }
    _Var9._M_current =
         (peers->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
  }
  uVar8 = (uint)((ulong)((long)_Var13._M_current - (long)_Var9._M_current) >> 3);
  if ((int)uVar10 < (int)uVar8) {
    uVar8 = uVar10;
  }
  local_68._0_8_ = pmVar1;
  local_68._8_4_ = local_68._8_4_ & 0xffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
  local_68[8] = true;
  iVar6 = (sett->m_store).m_ints._M_elems[0x20];
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  if (iVar6 == 0) {
LAB_00192ece:
    local_68._0_8_ = pmVar1;
    local_68[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    _Var2.super__Tuple_impl<1UL,_std::_Placeholder<2>,_int>.super__Tuple_impl<2UL,_int>.
    super__Head_base<2UL,_int,_false>._M_head_impl =
         (_Tuple_impl<1UL,_std::_Placeholder<2>,_int>)(sett->m_store).m_ints._M_elems[0x39];
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    _Var13._M_current =
         (local_58->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_start;
    _Var9._M_current =
         (local_58->
         super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if ((_Var13._M_current != _Var9._M_current) &&
       (_Var13._M_current + (int)uVar8 != _Var9._M_current)) {
      uVar7 = (long)_Var9._M_current - (long)_Var13._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      local_68._0_8_ = anon_unknown_10::unchoke_compare_rr;
      local_68._8_4_ =
           _Var2.super__Tuple_impl<1UL,_std::_Placeholder<2>,_int>.super__Tuple_impl<2UL,_int>.
           super__Head_base<2UL,_int,_false>._M_head_impl;
      std::
      __introselect<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>,int))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*,int)>>>
                (_Var13,(__normal_iterator<libtorrent::peer_connection_**,_std::vector<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>_>
                         )(_Var13._M_current + (int)uVar8),_Var9,
                 (ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*,_int)>_>
                  *)local_68);
    }
  }
  else {
    local_68._0_8_ = pmVar1;
    local_68[8] = false;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
    local_68[8] = true;
    iVar6 = (sett->m_store).m_ints._M_elems[0x20];
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
    if (iVar6 == 1) {
      _Var13._M_current =
           (local_58->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var9._M_current =
           (local_58->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (_Var13._M_current == _Var9._M_current) {
        return uVar10;
      }
      __nth._M_current = _Var13._M_current + (int)uVar8;
      if (__nth._M_current == _Var9._M_current) {
        return uVar10;
      }
      uVar7 = (long)_Var9._M_current - (long)_Var13._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = (uint)lVar4;
      local_68._0_8_ = anon_unknown_10::unchoke_compare_fastest_upload;
    }
    else {
      local_68._0_8_ = pmVar1;
      local_68[8] = false;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_68);
      local_68[8] = true;
      iVar6 = (sett->m_store).m_ints._M_elems[0x20];
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
      if (iVar6 != 2) goto LAB_00192ece;
      _Var13._M_current =
           (local_58->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var9._M_current =
           (local_58->
           super__Vector_base<libtorrent::peer_connection_*,_std::allocator<libtorrent::peer_connection_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (_Var13._M_current == _Var9._M_current) {
        return uVar10;
      }
      __nth._M_current = _Var13._M_current + (int)uVar8;
      if (__nth._M_current == _Var9._M_current) {
        return uVar10;
      }
      uVar7 = (long)_Var9._M_current - (long)_Var13._M_current >> 3;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar8 = (uint)lVar4;
      local_68._0_8_ = anon_unknown_10::unchoke_compare_anti_leech;
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<libtorrent::peer_connection**,std::vector<libtorrent::peer_connection*,std::allocator<libtorrent::peer_connection*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::_Bind<bool(*(std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::peer_connection_const*,libtorrent::peer_connection_const*)>>>
              (_Var13,__nth,_Var9,(ulong)((uVar8 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<std::_Bind<bool_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::peer_connection_*,_const_libtorrent::peer_connection_*)>_>
                *)local_68);
  }
  return uVar10;
}

Assistant:

int unchoke_sort(std::vector<peer_connection*>& peers
		, int const max_upload_rate
		, time_duration const unchoke_interval
		, aux::session_settings const& sett)
	{
#if TORRENT_USE_ASSERTS
		for (auto p : peers)
		{
			TORRENT_ASSERT(p->self());
			TORRENT_ASSERT(p->associated_torrent().lock());
		}
#endif

#if TORRENT_ABI_VERSION == 1
		// ==== BitTyrant ====
		//
		// if we're using the bittyrant unchoker, go through all peers that
		// we have unchoked already, and adjust our estimated reciprocation
		// rate. If the peer has reciprocated, lower the estimate, if it hasn't,
		// increase the estimate (this attempts to optimize "ROI" of upload
		// capacity, by sending just enough to be reciprocated).
		// For more information, see: http://bittyrant.cs.washington.edu/
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::bittyrant_choker)
		{
			for (auto const p : peers)
			{
				if (p->is_choked() || !p->is_interesting()) continue;

				if (!p->has_peer_choked())
				{
					// we're unchoked, we may want to lower our estimated
					// reciprocation rate
					p->decrease_est_reciprocation_rate();
				}
				else
				{
					// we've unchoked this peer, and it hasn't reciprocated
					// we may want to increase our estimated reciprocation rate
					p->increase_est_reciprocation_rate();
				}
			}

			// if we're using the bittyrant choker, sort peers by their return
			// on investment. i.e. download rate / upload rate
			// TODO: use an incremental partial_sort() here
			std::sort(peers.begin(), peers.end()
				, std::bind(&bittyrant_unchoke_compare, _1, _2));

			int upload_capacity_left = max_upload_rate;

			// now, figure out how many peers should be unchoked. We deduct the
			// estimated reciprocation rate from our upload_capacity estimate
			// until there none left
			int upload_slots = 0;

			for (auto const p : peers)
			{
				TORRENT_ASSERT(p != nullptr);

				if (p->est_reciprocation_rate() > upload_capacity_left) break;

				++upload_slots;
				upload_capacity_left -= p->est_reciprocation_rate();
			}

			return upload_slots;
		}
#else
		TORRENT_UNUSED(max_upload_rate);
#endif

		int upload_slots = sett.get_int(settings_pack::unchoke_slots_limit);
		if (upload_slots < 0)
			upload_slots = std::numeric_limits<int>::max();

		// ==== rate-based ====
		//
		// The rate based unchoker looks at our upload rate to peers, and find
		// a balance between number of upload slots and the rate we achieve. The
		// intention is to not spread upload bandwidth too thin, but also to not
		// unchoke few enough peers to not be able to saturate the up-link.
		// this is done by traversing the peers sorted by our upload rate to
		// them in decreasing rates. For each peer we increase our threshold
		// by 1 kB/s. The first peer we get to whom we upload slower than
		// the threshold, we stop and that's the number of unchoke slots we have.
		if (sett.get_int(settings_pack::choking_algorithm)
			== settings_pack::rate_based_choker)
		{
			// first reset the number of unchoke slots, because we'll calculate
			// it purely based on the current state of our peers.
			upload_slots = 0;

			// TODO: use an incremental partial_sort() here. We don't need
			// to sort the entire list

			// TODO: make the comparison function a free function and move it
			// into this cpp file
			std::sort(peers.begin(), peers.end()
				, std::bind(&upload_rate_compare, _1, _2));

			// TODO: make configurable
			int rate_threshold = 1024;

			for (auto const p : peers)
			{
				int const rate = int(p->uploaded_in_last_round()
					* 1000 / total_milliseconds(unchoke_interval));

				if (rate < rate_threshold) break;

				++upload_slots;

				// TODO: make configurable
				rate_threshold += 1024;
			}
			++upload_slots;
		}

		// sorts the peers that are eligible for unchoke by download rate and
		// secondary by total upload. The reason for this is, if all torrents are
		// being seeded, the download rate will be 0, and the peers we have sent
		// the least to should be unchoked

		// we use partial sort here, because we only care about the top
		// upload_slots peers.

		int const slots = std::min(upload_slots, int(peers.size()));

		if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::round_robin)
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);

			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::fastest_upload)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_fastest_upload, _1, _2));
		}
		else if (sett.get_int(settings_pack::seed_choking_algorithm)
			== settings_pack::anti_leech)
		{
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_anti_leech, _1, _2));
		}
		else
		{
			int const pieces = sett.get_int(settings_pack::seeding_piece_quota);
			std::nth_element(peers.begin(), peers.begin()
				+ slots, peers.end()
				, std::bind(&unchoke_compare_rr, _1, _2, pieces));

			TORRENT_ASSERT_FAIL();
		}

		return upload_slots;
	}